

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawRingLines(Vector2 center,float innerRadius,float outerRadius,float startAngle,
                  float endAngle,int segments,Color color)

{
  uchar y;
  uchar z;
  int iVar1;
  uchar x;
  uchar w;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float __x;
  float local_78;
  float local_48;
  float fStack_44;
  
  if ((startAngle == endAngle) && (!NAN(startAngle) && !NAN(endAngle))) {
    return;
  }
  fVar7 = (float)(~-(uint)(outerRadius < innerRadius) & (uint)outerRadius |
                 (~-(uint)(0.0 < innerRadius) & 0x3dcccccd |
                 -(uint)(0.0 < innerRadius) & (uint)innerRadius) &
                 -(uint)(outerRadius < innerRadius));
  if (innerRadius <= outerRadius) {
    outerRadius = innerRadius;
  }
  local_78 = endAngle;
  if (startAngle <= endAngle) {
    local_78 = startAngle;
    startAngle = endAngle;
  }
  fVar2 = startAngle - local_78;
  fVar3 = ceilf(fVar2 / 90.0);
  if (segments < (int)fVar3) {
    fVar4 = -0.5 / fVar7 + 1.0;
    fVar4 = fVar4 * fVar4;
    fVar4 = acosf(fVar4 + fVar4 + -1.0);
    fVar4 = ceilf(6.2831855 / fVar4);
    iVar1 = (int)((fVar4 * fVar2) / 360.0);
    segments = (int)fVar3;
    if (0 < iVar1) {
      segments = iVar1;
    }
  }
  if (0.0 < outerRadius) {
    y = color.g;
    z = color.b;
    rlBegin(1);
    x = color.r;
    w = color.a;
    rlColor4ub(x,y,z,w);
    fVar3 = local_78 * 0.017453292;
    fVar4 = cosf(fVar3);
    local_48 = center.x;
    fStack_44 = center.y;
    fVar5 = sinf(fVar3);
    rlVertex2f(fVar4 * fVar7 + local_48,fVar5 * fVar7 + fStack_44);
    fVar4 = cosf(fVar3);
    fVar3 = sinf(fVar3);
    rlVertex2f(fVar4 * outerRadius + local_48,fStack_44 + fVar3 * outerRadius);
    if (0 < segments) {
      fVar3 = (float)segments;
      do {
        rlColor4ub(x,y,z,w);
        __x = local_78 * 0.017453292;
        fVar4 = cosf(__x);
        fVar5 = sinf(__x);
        rlVertex2f(fVar4 * fVar7 + local_48,fVar5 * fVar7 + fStack_44);
        local_78 = local_78 + fVar2 / fVar3;
        fVar4 = local_78 * 0.017453292;
        fVar5 = cosf(fVar4);
        fVar6 = sinf(fVar4);
        rlVertex2f(fVar5 * fVar7 + local_48,fVar6 * fVar7 + fStack_44);
        fVar5 = cosf(__x);
        fVar6 = sinf(__x);
        rlVertex2f(fVar5 * outerRadius + local_48,fVar6 * outerRadius + fStack_44);
        fVar5 = cosf(fVar4);
        fVar4 = sinf(fVar4);
        rlVertex2f(fVar5 * outerRadius + local_48,fVar4 * outerRadius + fStack_44);
        segments = segments + -1;
      } while (segments != 0);
    }
    rlColor4ub(x,y,z,w);
    local_78 = local_78 * 0.017453292;
    fVar2 = cosf(local_78);
    fVar3 = sinf(local_78);
    rlVertex2f(fVar2 * fVar7 + local_48,fVar7 * fVar3 + fStack_44);
    fVar7 = cosf(local_78);
    fVar2 = sinf(local_78);
    rlVertex2f(fVar7 * outerRadius + local_48,outerRadius * fVar2 + fStack_44);
    rlEnd();
    return;
  }
  DrawCircleSectorLines(center,fVar7,local_78,startAngle,segments,color);
  return;
}

Assistant:

void DrawRingLines(Vector2 center, float innerRadius, float outerRadius, float startAngle, float endAngle, int segments, Color color)
{
    if (startAngle == endAngle) return;

    // Function expects (outerRadius > innerRadius)
    if (outerRadius < innerRadius)
    {
        float tmp = outerRadius;
        outerRadius = innerRadius;
        innerRadius = tmp;

        if (outerRadius <= 0.0f) outerRadius = 0.1f;
    }

    // Function expects (endAngle > startAngle)
    if (endAngle < startAngle)
    {
        // Swap values
        float tmp = startAngle;
        startAngle = endAngle;
        endAngle = tmp;
    }

    int minSegments = (int)ceilf((endAngle - startAngle)/90);

    if (segments < minSegments)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/outerRadius, 2) - 1);
        segments = (int)((endAngle - startAngle)*ceilf(2*PI/th)/360);

        if (segments <= 0) segments = minSegments;
    }

    if (innerRadius <= 0.0f)
    {
        DrawCircleSectorLines(center, outerRadius, startAngle, endAngle, segments, color);
        return;
    }

    float stepLength = (endAngle - startAngle)/(float)segments;
    float angle = startAngle;
    bool showCapLines = true;

    rlBegin(RL_LINES);
        if (showCapLines)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*innerRadius, center.y + sinf(DEG2RAD*angle)*innerRadius);
        }

        for (int i = 0; i < segments; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*outerRadius);

            rlVertex2f(center.x + cosf(DEG2RAD*angle)*innerRadius, center.y + sinf(DEG2RAD*angle)*innerRadius);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*innerRadius);

            angle += stepLength;
        }

        if (showCapLines)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*innerRadius, center.y + sinf(DEG2RAD*angle)*innerRadius);
        }
    rlEnd();
}